

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int32_t al_fread32be(ALLEGRO_FILE *f)

{
  uint uVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uchar b [4];
  uint local_4;
  
  local_4 = (uint)((ulong)in_RAX >> 0x20);
  sVar2 = al_fread(f,&local_4,4);
  uVar1 = 0xffffffff;
  if (sVar2 == 4) {
    uVar1 = local_4 >> 0x18 | (local_4 & 0xff0000) >> 8 | (local_4 & 0xff00) << 8 | local_4 << 0x18;
  }
  return uVar1;
}

Assistant:

int32_t al_fread32be(ALLEGRO_FILE *f)
{
   unsigned char b[4];
   ASSERT(f);

   if (al_fread(f, b, 4) == 4) {
      return (((int32_t)b[0] << 24) | ((int32_t)b[1] << 16) |
              ((int32_t)b[2] << 8) | (int32_t)b[3]);
   }

   return EOF;
}